

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O2

int osgen_sb_mode(osgen_txtwin_t *win,int event_type,os_event_info_t *event_info)

{
  int *piVar1;
  uint uVar2;
  ulong uVar3;
  osgen_txtwin_t *poVar4;
  int iVar5;
  size_t lines;
  int iVar6;
  
  if (S_sbmode_win != win && S_sbmode_win != (osgen_txtwin_t *)0x0) {
    osgen_sb_mode_end();
  }
  poVar4 = S_sbmode_win;
  if (S_sbmode_win == (osgen_txtwin_t *)0x0) {
    if (win->txtbuf == (char *)0x0) {
      return 0;
    }
    uVar3 = (win->base).ht;
    if (uVar3 < 2 || win->line_count <= uVar3) {
      return 0;
    }
    piVar1 = &(win->base).winy;
    S_sbmode_win = win;
    *piVar1 = *piVar1 + 1;
    (win->base).ht = uVar3 - 1;
    piVar1 = &(win->base).scrolly;
    *piVar1 = *piVar1 + 1;
    S_sbmode_orig_x = (win->base).x;
    S_sbmode_orig_txtfree = win->txtfree;
    S_sbmode_orig_last_line = osgen_get_line_ptr(win,(win->base).y);
    ossaddsb_input(win,S_gets_internal_buf,0);
    S_sbmode_orig_scrolly = (win->base).scrolly;
    osgen_draw_sb_mode_line();
  }
  if (event_type != 1) {
    return 1;
  }
  uVar2 = event_info->key[0];
  iVar6 = uVar2 << 0x18;
  if (((((uVar2 & 0xe0) == 0) && (iVar6 != 0x8000000)) && (iVar6 != 0xd000000)) &&
     (iVar6 != 0xa000000)) {
    iVar5 = 1;
  }
  else {
    osgen_sb_mode_end();
    iVar5 = 0;
  }
  if ((uVar2 & 0xff) != 0) {
    if (iVar6 != 0x1b000000) {
      return iVar5;
    }
    goto switchD_001ecc22_caseD_8;
  }
  switch(event_info->key[1]) {
  case 1:
    iVar6 = 1;
    goto LAB_001ecc78;
  case 2:
    lines = 1;
    goto LAB_001ecc4c;
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 9:
    goto switchD_001ecc22_caseD_3;
  case 8:
    break;
  case 10:
    if (poVar4 == (osgen_txtwin_t *)0x0) {
      return iVar5;
    }
    break;
  case 0xb:
    uVar3 = (win->base).ht;
    iVar6 = 1;
    if (1 < uVar3) {
      iVar6 = (int)uVar3 + -1;
    }
LAB_001ecc78:
    osgen_scroll_win_back(win,iVar6);
    return iVar5;
  case 0xc:
    uVar3 = (win->base).ht;
    lines = 1;
    if (1 < uVar3) {
      lines = uVar3 - 1;
    }
LAB_001ecc4c:
    osgen_scroll_win_fwd(win,lines);
    return iVar5;
  default:
    if (event_info->key[1] != 0x20) {
      return iVar5;
    }
  }
switchD_001ecc22_caseD_8:
  osgen_sb_mode_end();
switchD_001ecc22_caseD_3:
  return iVar5;
}

Assistant:

static int osgen_sb_mode(osgen_txtwin_t *win, int event_type,
                         os_event_info_t *event_info)
{
    int ret;
    char c;
    int just_started;

    /* if we were doing scrollback in a different window, cancel it */
    if (S_sbmode_win != 0 && S_sbmode_win != win)
        osgen_sb_mode_end();

    /* note if we're just entering scrollback mode */
    just_started = (S_sbmode_win == 0);

    /* if scrollback mode isn't already in progress, set it up */
    if (just_started)
    {
        /* if there's no buffer, we can't enter scrollback mode */
        if (win->txtbuf == 0)
            return FALSE;

        /* 
         *   If the number of lines in the scrollback buffer doesn't exceed
         *   the number of lines displayed in the window, then don't bother
         *   entering scrollback mode.  If the window isn't at least two
         *   lines high, don't allow it either, as we need space to draw our
         *   mode line.  
         */
        if (win->line_count <= win->base.ht || win->base.ht < 2)
            return FALSE;

        /* remember the window involved in scrollback */
        S_sbmode_win = win;
        
        /* 
         *   Shrink the window one line at the top, to make room for the mode
         *   line.  Compensate by bumping the scrolling position forward a
         *   line, to keep the lines that will remain visible in the rest of
         *   the window at the same place on the screen.  
         */
        win->base.winy += 1;
        win->base.ht -= 1;
        win->base.scrolly += 1;

        /*
         *   Temporarily add the command buffer to the scrollback buffer, so
         *   that it shows up when we're scrolling.  To facilitate removing
         *   the added text later, remember the current free pointer, last
         *   line pointer, x document position.  
         */
        S_sbmode_orig_x = win->base.x;
        S_sbmode_orig_txtfree = win->txtfree;
        S_sbmode_orig_last_line = osgen_get_line_ptr(win, win->base.y);
        ossaddsb_input(win, S_gets_buf, FALSE);

        /* remember the original scrolling position */
        S_sbmode_orig_scrolly = win->base.scrolly;

        /* draw the mode line */
        osgen_draw_sb_mode_line();
    }

    /* presume we'll handle the event */
    ret = TRUE;

    /* check the event */
    switch(event_type)
    {
    case OS_EVT_KEY:
        /* 
         *   If it's a regular key, exit scrollback mode immediately, and
         *   let the caller handle the event normally.  This allows the user
         *   to resume typing even while scrollback is active; we'll simply
         *   cancel the scrollback and resume editing with the event that
         *   canceled the scrollback.  
         */
        c = event_info->key[0];
        if ((unsigned char)c >= 32 || c == '\n' || c == '\r' || c == 8)
        {
            /* it's a regular key - terminate scrollback mode */
            osgen_sb_mode_end();

            /* let the caller handle the event */
            ret = FALSE;
        }

        /* if it's the escape key, we're done */
        if (c == 27)
        {
            osgen_sb_mode_end();
            break;
        }

        /* if it's not a special keystroke, we're done with it */
        if (c != '\0')
            break;

        /* it's a special keystroke - check the command ID */
        switch(event_info->key[1])
        {
        case CMD_SCR:
            /* if we're not just toggling in to scrollback mode, toggle out */
            if (!just_started)
                osgen_sb_mode_end();
            break;
            
        case CMD_KILL:
        case CMD_EOF:
            /* it's a termination key - cancel scrollback mode */
            osgen_sb_mode_end();
            break;

        case CMD_UP:
            /* scroll back a line */
            osgen_scroll_win_back(win, 1);
            break;

        case CMD_DOWN:
            /* scroll forward a line */
            osgen_scroll_win_fwd(win, 1);
            break;
            
        case CMD_PGUP:
            /* move back by one window height */
            osgen_scroll_win_back(win, win->base.ht > 1
                                  ? win->base.ht - 1 : 1);
            break;
            
        case CMD_PGDN:
            /* move forward by one window height */
            osgen_scroll_win_fwd(win, win->base.ht > 1
                                 ? win->base.ht - 1 : 1);
            break;
        }

        /* done with the key */
        break;

    default:
        /* 
         *   ignore any other events we receive, but consider them processed
         *   - even though we're ignoring the event, we're deliberately
         *   ignoring the event as our way of processing it 
         */
        break;
    }

    /* return the 'processed' indication to the caller */
    return ret;
}